

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

ErrorStackOption * __thiscall
ritobin::io::json_impl::json_value_impl<ritobin::Pointer,_(ritobin::Category)8>::from_json
          (ErrorStackOption *__return_storage_ptr__,
          json_value_impl<ritobin::Pointer,_(ritobin::Category)8> *this,Pointer *value,json *json)

{
  bool bVar1;
  const_reference pvVar2;
  Field *value_00;
  reference this_00;
  size_t index;
  string *this_01;
  json_impl *this_02;
  const_iterator __begin3;
  const_iterator __end3;
  allocator<char> local_101;
  ErrorStack local_100;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  const_iterator local_50;
  
  if ((char)(value->name).hash_ == '\x01') {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[5],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)value,(char (*) [5])0x12c2b6);
    if (bVar1) {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[6],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)value,(char (*) [6])"items");
      if (bVar1) {
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)value,"name");
        bVar1 = hash_from_json<ritobin::FNV1a>((FNV1a *)this,pvVar2);
        if (bVar1) {
          pvVar2 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)value,"items");
          if (pvVar2->m_type == array) {
            pvVar2 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)value,"items");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::cbegin((const_iterator *)&local_100,pvVar2);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::cend(&local_50,pvVar2);
            this_02 = (json_impl *)0x0;
            while( true ) {
              bVar1 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_100,&local_50);
              if (!bVar1) {
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
                return __return_storage_ptr__;
              }
              value_00 = (Field *)nlohmann::detail::
                                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               *)&local_100);
              this_00 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                                  ((vector<ritobin::Field,_std::allocator<ritobin::Field>_> *)
                                   (this + 0x28));
              item_from_json(__return_storage_ptr__,(json_impl *)this_00,value_00,json);
              if ((__return_storage_ptr__->
                  super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload
                  .super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged ==
                  true) break;
              std::_Optional_payload_base<ritobin::io::json_impl::ErrorStack>::_M_reset
                        ((_Optional_payload_base<ritobin::io::json_impl::ErrorStack> *)
                         __return_storage_ptr__);
              this_02 = this_02 + 1;
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_100);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"items",&local_101);
            to_index(&local_90,&local_d0);
            to_index_abi_cxx11_(&local_b0,this_02,index);
            std::operator+(&local_70,&local_90,&local_b0);
            ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_90);
            this_01 = &local_d0;
            goto LAB_0011d692;
          }
          local_100.message = "json[\"items\"].is_array()";
        }
        else {
          local_100.message = "hash_from_json(value.name, json[\"name\"])";
        }
      }
      else {
        local_100.message = "json.contains(\"items\")";
      }
    }
    else {
      local_100.message = "json.contains(\"name\")";
    }
  }
  else {
    local_100.message = "json.is_object()";
  }
  local_100.type = "pointer";
  this_01 = &local_100.path;
  local_100.path._M_dataplus._M_p = (pointer)&local_100.path.field_2;
  local_100.path._M_string_length = 0;
  local_100.path.field_2._M_local_buf[0] = '\0';
  std::optional<ritobin::io::json_impl::ErrorStack>::
  optional<ritobin::io::json_impl::ErrorStack,_true>(__return_storage_ptr__,&local_100);
LAB_0011d692:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("name"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(hash_from_json(value.name, json["name"]));
            bin_json_assert(json["items"].is_array());
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back();
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }